

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::FileGenerator::GenerateDescriptorInitializationCodeForImmutable
          (FileGenerator *this,Printer *printer)

{
  size_t *output;
  ClassNameResolver *this_00;
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *this_01;
  MessageGenerator *pMVar4;
  scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> *this_02;
  ExtensionGenerator *pEVar5;
  DescriptorPool *alternate_pool;
  size_type sVar6;
  GeneratorFactory *pGVar7;
  reference ppFVar8;
  undefined4 extraout_var;
  FileDescriptor *pFVar9;
  undefined1 local_230 [8];
  string dependency;
  int i_2;
  scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> local_200;
  scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> generator;
  _Rb_tree_const_iterator<const_google::protobuf::FieldDescriptor_*> local_1e8;
  iterator it;
  FieldDescriptorSet extensions;
  string file_data;
  FileDescriptorProto file_proto;
  int i_1;
  int i;
  int method_num;
  int bytecode_estimate;
  SharedCodeGenerator shared_code_generator;
  allocator local_39;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  FileGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"",&local_39);
  io::Printer::Print(printer,
                     "public static com.google.protobuf.Descriptors.FileDescriptor\n    getDescriptor() {\n  return descriptor;\n}\nprivate static $final$ com.google.protobuf.Descriptors.FileDescriptor\n    descriptor;\nstatic {\n"
                     ,"final",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  io::Printer::Indent(local_18);
  SharedCodeGenerator::SharedCodeGenerator
            ((SharedCodeGenerator *)&method_num,this->file_,&this->options_);
  SharedCodeGenerator::GenerateDescriptors((SharedCodeGenerator *)&method_num,local_18);
  i = 0;
  i_1 = 0;
  for (file_proto.source_code_info_._4_4_ = 0;
      iVar3 = FileDescriptor::message_type_count(this->file_),
      file_proto.source_code_info_._4_4_ < iVar3;
      file_proto.source_code_info_._4_4_ = file_proto.source_code_info_._4_4_ + 1) {
    this_01 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
              ::operator[](&this->message_generators_,(long)file_proto.source_code_info_._4_4_);
    pMVar4 = internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::operator->
                       (this_01);
    iVar3 = (*pMVar4->_vptr_MessageGenerator[3])(pMVar4,local_18);
    i = i + iVar3;
    anon_unknown_0::MaybeRestartJavaMethod
              (local_18,&i,&i_1,"_clinit_autosplit_dinit_$method_num$();\n",
               "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }
  for (file_proto.source_code_info_._0_4_ = 0; iVar3 = FileDescriptor::extension_count(this->file_),
      (int)file_proto.source_code_info_ < iVar3;
      file_proto.source_code_info_._0_4_ = (int)file_proto.source_code_info_ + 1) {
    this_02 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,(long)(int)file_proto.source_code_info_);
    pEVar5 = internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>::operator->
                       (this_02);
    iVar3 = (*pEVar5->_vptr_ExtensionGenerator[3])(pEVar5,local_18);
    i = i + iVar3;
    anon_unknown_0::MaybeRestartJavaMethod
              (local_18,&i,&i_1,"_clinit_autosplit_dinit_$method_num$();\n",
               "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)((long)&file_data.field_2 + 8));
  FileDescriptor::CopyTo(this->file_,(FileDescriptorProto *)((long)&file_data.field_2 + 8));
  output = &extensions._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::__cxx11::string::string((string *)output);
  MessageLite::SerializeToString((MessageLite *)((long)&file_data.field_2 + 8),(string *)output);
  std::
  set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::set((set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         *)&it);
  alternate_pool = FileDescriptor::pool(this->file_);
  anon_unknown_0::CollectExtensions
            ((FileDescriptorProto *)((long)&file_data.field_2 + 8),alternate_pool,
             (FieldDescriptorSet *)&it,
             (string *)&extensions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  sVar6 = std::
          set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::size((set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)&it);
  if (sVar6 != 0) {
    io::Printer::Print(local_18,
                       "com.google.protobuf.ExtensionRegistry registry =\n    com.google.protobuf.ExtensionRegistry.newInstance();\n"
                      );
    std::_Rb_tree_const_iterator<const_google::protobuf::FieldDescriptor_*>::_Rb_tree_const_iterator
              (&local_1e8);
    local_1e8._M_node =
         (_Base_ptr)
         std::
         set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ::begin((set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)&it);
    while( true ) {
      generator.ptr_ =
           (ExtensionGenerator *)
           std::
           set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::end((set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)&it);
      bVar2 = std::operator!=(&local_1e8,(_Self *)&generator);
      if (!bVar2) break;
      pGVar7 = internal::scoped_ptr<google::protobuf::compiler::java::GeneratorFactory>::operator->
                         (&this->generator_factory_);
      ppFVar8 = std::_Rb_tree_const_iterator<const_google::protobuf::FieldDescriptor_*>::operator*
                          (&local_1e8);
      iVar3 = (*pGVar7->_vptr_GeneratorFactory[3])(pGVar7,*ppFVar8);
      internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>::scoped_ptr
                (&local_200,(ExtensionGenerator *)CONCAT44(extraout_var,iVar3));
      pEVar5 = internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>::
               operator->(&local_200);
      iVar3 = (*pEVar5->_vptr_ExtensionGenerator[4])(pEVar5,local_18);
      i = i + iVar3;
      anon_unknown_0::MaybeRestartJavaMethod
                (local_18,&i,&i_1,"_clinit_autosplit_dinit_$method_num$(registry);\n",
                 "private static void _clinit_autosplit_dinit_$method_num$(\n    com.google.protobuf.ExtensionRegistry registry) {\n"
                );
      internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>::~scoped_ptr
                (&local_200);
      std::_Rb_tree_const_iterator<const_google::protobuf::FieldDescriptor_*>::operator++
                (&local_1e8,0);
    }
    io::Printer::Print(local_18,
                       "com.google.protobuf.Descriptors.FileDescriptor\n    .internalUpdateFileDescriptor(descriptor, registry);\n"
                      );
  }
  for (dependency.field_2._12_4_ = 0; uVar1 = dependency.field_2._12_4_,
      iVar3 = FileDescriptor::dependency_count(this->file_), (int)uVar1 < iVar3;
      dependency.field_2._12_4_ = dependency.field_2._12_4_ + 1) {
    pFVar9 = FileDescriptor::dependency(this->file_,dependency.field_2._12_4_);
    bVar2 = ShouldIncludeDependency(this,pFVar9,true);
    if (bVar2) {
      this_00 = this->name_resolver_;
      pFVar9 = FileDescriptor::dependency(this->file_,dependency.field_2._12_4_);
      ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
                ((string *)local_230,this_00,pFVar9);
      io::Printer::Print(local_18,"$dependency$.getDescriptor();\n","dependency",(string *)local_230
                        );
      std::__cxx11::string::~string((string *)local_230);
    }
  }
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"}\n");
  std::
  set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~set((set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *)&it);
  std::__cxx11::string::~string
            ((string *)&extensions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)((long)&file_data.field_2 + 8));
  SharedCodeGenerator::~SharedCodeGenerator((SharedCodeGenerator *)&method_num);
  return;
}

Assistant:

void FileGenerator::GenerateDescriptorInitializationCodeForImmutable(
    io::Printer* printer) {
  printer->Print(
    "public static com.google.protobuf.Descriptors.FileDescriptor\n"
    "    getDescriptor() {\n"
    "  return descriptor;\n"
    "}\n"
    "private static $final$ com.google.protobuf.Descriptors.FileDescriptor\n"
    "    descriptor;\n"
    "static {\n",
    // TODO(dweis): Mark this as final.
    "final", "");
  printer->Indent();

  SharedCodeGenerator shared_code_generator(file_, options_);
  shared_code_generator.GenerateDescriptors(printer);

  int bytecode_estimate = 0;
  int method_num = 0;

  for (int i = 0; i < file_->message_type_count(); i++) {
    bytecode_estimate += message_generators_[i]->GenerateStaticVariableInitializers(printer);
    MaybeRestartJavaMethod(
      printer,
      &bytecode_estimate, &method_num,
      "_clinit_autosplit_dinit_$method_num$();\n",
      "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }
  for (int i = 0; i < file_->extension_count(); i++) {
    bytecode_estimate += extension_generators_[i]->GenerateNonNestedInitializationCode(printer);
    MaybeRestartJavaMethod(
      printer,
      &bytecode_estimate, &method_num,
      "_clinit_autosplit_dinit_$method_num$();\n",
      "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }

  // Proto compiler builds a DescriptorPool, which holds all the descriptors to
  // generate, when processing the ".proto" files. We call this DescriptorPool
  // the parsed pool (a.k.a. file_->pool()).
  //
  // Note that when users try to extend the (.*)DescriptorProto in their
  // ".proto" files, it does not affect the pre-built FileDescriptorProto class
  // in proto compiler. When we put the descriptor data in the file_proto, those
  // extensions become unknown fields.
  //
  // Now we need to find out all the extension value to the (.*)DescriptorProto
  // in the file_proto message, and prepare an ExtensionRegistry to return.
  //
  // To find those extensions, we need to parse the data into a dynamic message
  // of the FileDescriptor based on the builder-pool, then we can use
  // reflections to find all extension fields
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);
  string file_data;
  file_proto.SerializeToString(&file_data);
  FieldDescriptorSet extensions;
  CollectExtensions(file_proto, *file_->pool(), &extensions, file_data);

  if (extensions.size() > 0) {
    // Must construct an ExtensionRegistry containing all existing extensions
    // and use it to parse the descriptor data again to recognize extensions.
    printer->Print(
      "com.google.protobuf.ExtensionRegistry registry =\n"
      "    com.google.protobuf.ExtensionRegistry.newInstance();\n");
    FieldDescriptorSet::iterator it;
    for (it = extensions.begin(); it != extensions.end(); it++) {
      google::protobuf::scoped_ptr<ExtensionGenerator> generator(
          generator_factory_->NewExtensionGenerator(*it));
      bytecode_estimate += generator->GenerateRegistrationCode(printer);
      MaybeRestartJavaMethod(
        printer,
        &bytecode_estimate, &method_num,
        "_clinit_autosplit_dinit_$method_num$(registry);\n",
        "private static void _clinit_autosplit_dinit_$method_num$(\n"
        "    com.google.protobuf.ExtensionRegistry registry) {\n");
    }
    printer->Print(
      "com.google.protobuf.Descriptors.FileDescriptor\n"
      "    .internalUpdateFileDescriptor(descriptor, registry);\n");
  }

  // Force descriptor initialization of all dependencies.
  for (int i = 0; i < file_->dependency_count(); i++) {
    if (ShouldIncludeDependency(file_->dependency(i), true)) {
      string dependency =
          name_resolver_->GetImmutableClassName(file_->dependency(i));
      printer->Print(
        "$dependency$.getDescriptor();\n",
        "dependency", dependency);
    }
  }

  printer->Outdent();
  printer->Print(
    "}\n");
}